

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walkExpr(Walker *pWalker,Expr *pExpr)

{
  Select *p;
  Window *pWVar1;
  uint uVar2;
  int iVar3;
  Expr *pEVar4;
  
  do {
    pEVar4 = pExpr;
    uVar2 = (*pWalker->xExprCallback)(pWalker,pEVar4);
    if (uVar2 != 0) {
      return uVar2 & 2;
    }
    if ((pEVar4->flags & 0x804000) != 0) {
      return 0;
    }
    if ((pEVar4->pLeft != (Expr *)0x0) && (iVar3 = walkExpr(pWalker,pEVar4->pLeft), iVar3 != 0)) {
      return 2;
    }
    pExpr = pEVar4->pRight;
  } while (pEVar4->pRight != (Expr *)0x0);
  p = (Select *)(pEVar4->x).pList;
  if ((pEVar4->flags & 0x800) == 0) {
    if (p == (Select *)0x0) goto LAB_00150bb6;
    iVar3 = sqlite3WalkExprList(pWalker,(ExprList *)p);
  }
  else {
    iVar3 = sqlite3WalkSelect(pWalker,p);
  }
  if (iVar3 != 0) {
    return 2;
  }
LAB_00150bb6:
  if ((pEVar4->flags & 0x1000000) != 0) {
    pWVar1 = (pEVar4->y).pWin;
    iVar3 = sqlite3WalkExprList(pWalker,pWVar1->pPartition);
    if (iVar3 != 0) {
      return 2;
    }
    iVar3 = sqlite3WalkExprList(pWalker,pWVar1->pOrderBy);
    if (iVar3 != 0) {
      return 2;
    }
    iVar3 = sqlite3WalkExpr(pWalker,pWVar1->pFilter);
    if (iVar3 != 0) {
      return 2;
    }
  }
  return 0;
}

Assistant:

static SQLITE_NOINLINE int walkExpr(Walker *pWalker, Expr *pExpr){
  int rc;
  testcase( ExprHasProperty(pExpr, EP_TokenOnly) );
  testcase( ExprHasProperty(pExpr, EP_Reduced) );
  while(1){
    rc = pWalker->xExprCallback(pWalker, pExpr);
    if( rc ) return rc & WRC_Abort;
    if( !ExprHasProperty(pExpr,(EP_TokenOnly|EP_Leaf)) ){
      if( pExpr->pLeft && walkExpr(pWalker, pExpr->pLeft) ) return WRC_Abort;
       assert( pExpr->x.pList==0 || pExpr->pRight==0 );
      if( pExpr->pRight ){
        pExpr = pExpr->pRight;
        continue;
      }else if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        if( sqlite3WalkSelect(pWalker, pExpr->x.pSelect) ) return WRC_Abort;
      }else if( pExpr->x.pList ){
        if( sqlite3WalkExprList(pWalker, pExpr->x.pList) ) return WRC_Abort;
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(pExpr, EP_WinFunc) ){
        Window *pWin = pExpr->y.pWin;
        if( sqlite3WalkExprList(pWalker, pWin->pPartition) ) return WRC_Abort;
        if( sqlite3WalkExprList(pWalker, pWin->pOrderBy) ) return WRC_Abort;
        if( sqlite3WalkExpr(pWalker, pWin->pFilter) ) return WRC_Abort;
      }
#endif
    }
    break;
  }
  return WRC_Continue;
}